

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMdR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  string *psVar10;
  char *pcVar11;
  uint *puVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 offset;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *delta;
  int v1;
  ParseContext *local_78 [2];
  MessageLite *local_68;
  uint64_t local_60;
  TcParseTableBase *local_58;
  undefined1 local_50 [32];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  cVar1 = *ptr;
  pMVar8 = *(MessageLite **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  offset = data.field_0 >> 0x30;
  local_68 = msg;
  local_60 = hasbits;
  local_58 = table;
  local_50._24_8_ = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(msg,offset.data);
  local_50._16_8_ = MessageLite::GetTcParseTable(pMVar8);
  local_50._8_8_ = local_50._16_8_ + 0x38;
LAB_00144094:
  delta = (ParseContext *)local_50._24_8_;
  pMVar8 = AddMessage((TcParseTableBase *)local_50._16_8_,(RepeatedPtrFieldBase *)local_50._24_8_);
  local_78[0] = (ParseContext *)
                ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 1);
  uVar6 = ReadSize((char **)local_78);
  ctx_00 = local_78[0];
  if ((local_78[0] != (ParseContext *)0x0) && (0 < ctx->depth_)) {
    offset.data._4_4_ = 0;
    offset.data._0_4_ = uVar6;
    delta = ctx;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)(local_50 + 4),(char *)ctx,(int)local_78[0])
    ;
    uVar4 = local_50._8_8_;
    uVar3 = local_50._4_4_;
    v1 = ctx->depth_ + -1;
    ctx->depth_ = v1;
    ctx_00 = extraout_RDX;
    if (local_78[0] != (ParseContext *)0x0) {
      while (bVar5 = ParseContext::Done(ctx,(char **)local_78), !bVar5) {
        uVar2 = *(ushort *)&(local_78[0]->super_EpsCopyInputStream).limit_end_;
        uVar7 = (uint)((TcParseTableBase *)(uVar4 + -0x38))->fast_idx_mask & (uint)uVar2;
        if ((uVar7 & 7) != 0) goto LAB_00144284;
        uVar9 = (ulong)(uVar7 & 0xfffffff8);
        offset.data = (ulong)uVar2 ^ *(ulong *)((uint8_t *)(uVar4 + 8) + uVar9 * 2);
        local_78[0] = (ParseContext *)
                      (**(code **)((uint16_t *)uVar4 + uVar9))
                                (pMVar8,local_78[0],ctx,offset.data,
                                 (TcParseTableBase *)(uVar4 + -0x38),0);
        if ((local_78[0] == (ParseContext *)0x0) ||
           ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      ptr = (char *)local_78[0];
      if ((((TcParseTableBase *)(uVar4 + -0x38))->field_0x9 & 1) != 0) {
        ptr = (*((TcParseTableBase *)(uVar4 + -0x38))->post_loop_handler)
                        (pMVar8,(char *)local_78[0],ctx);
      }
      if (((ParseContext *)ptr != (ParseContext *)0x0) &&
         (psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                              (v1,ctx->depth_,"old_depth == depth_"), psVar10 != (string *)0x0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,psVar10->_M_string_length,(psVar10->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_78);
      }
      ctx->depth_ = ctx->depth_ + 1;
      local_50._0_4_ = uVar3;
      delta = (ParseContext *)local_50;
      bVar5 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)delta);
      ctx_00 = extraout_RDX_00;
      if ((bVar5) && ((ParseContext *)ptr != (ParseContext *)0x0)) goto code_r0x001441ab;
    }
  }
  pcVar11 = Error(local_68,(char *)delta,ctx_00,(TcFieldData)offset,local_58,local_60);
  return pcVar11;
code_r0x001441ab:
  if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)local_58->has_bits_offset != 0) {
      puVar12 = RefAt<unsigned_int>(local_68,(ulong)local_58->has_bits_offset);
      *puVar12 = *puVar12 | (uint)local_60;
    }
    return (char *)(ParseContext *)ptr;
  }
  if (*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ != cVar1) {
    uVar2 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
    uVar7 = (uint)local_58->fast_idx_mask & (uint)uVar2;
    if ((uVar7 & 7) == 0) {
      uVar9 = (ulong)(uVar7 & 0xfffffff8);
      pcVar11 = (char *)(**(code **)(&local_58[1].has_bits_offset + uVar9))
                                  (local_68,ptr,ctx,
                                   (ulong)uVar2 ^ *(ulong *)(&local_58[1].fast_idx_mask + uVar9 * 2)
                                   ,local_58,local_60);
      return pcVar11;
    }
LAB_00144284:
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  goto LAB_00144094;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}